

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O0

void __thiscall
Assimp::DropFaceNormalsProcess::Execute(DropFaceNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  DeadlyImportError *this_00;
  bool bVar3;
  uint local_54;
  uint a;
  bool bHas;
  allocator local_39;
  string local_38;
  aiScene *local_18;
  aiScene *pScene_local;
  DropFaceNormalsProcess *this_local;
  
  local_18 = pScene;
  pScene_local = (aiScene *)this;
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"DropFaceNormalsProcess begin");
  if ((local_18->mFlags & 8) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,&local_39);
    DeadlyImportError::DeadlyImportError(this_00,&local_38);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  bVar3 = false;
  for (local_54 = 0; local_54 < local_18->mNumMeshes; local_54 = local_54 + 1) {
    bVar1 = DropMeshFaceNormals(this,local_18->mMeshes[local_54]);
    bVar3 = bVar3 || bVar1;
  }
  if (bVar3) {
    pLVar2 = DefaultLogger::get();
    Logger::info(pLVar2,"DropFaceNormalsProcess finished. Face normals have been removed");
  }
  else {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"DropFaceNormalsProcess finished. No normals were present");
  }
  return;
}

Assistant:

void DropFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("DropFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        bHas |= this->DropMeshFaceNormals( pScene->mMeshes[a]);
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("DropFaceNormalsProcess finished. "
            "Face normals have been removed");
    } else {
        ASSIMP_LOG_DEBUG("DropFaceNormalsProcess finished. "
            "No normals were present");
    }
}